

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstracttestlogger.cpp
# Opt level: O0

void __thiscall QAbstractTestLogger::outputString(QAbstractTestLogger *this,char *msg)

{
  size_t sVar1;
  char *__dest;
  char *in_RSI;
  QAbstractTestLogger *in_RDI;
  char *filtered;
  
  if (in_RDI->stream == (FILE *)0x0) {
    qt_assert("stream",
              "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstracttestlogger.cpp"
              ,0xc6);
  }
  if (in_RSI == (char *)0x0) {
    qt_assert("msg",
              "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstracttestlogger.cpp"
              ,199);
  }
  sVar1 = strlen(in_RSI);
  __dest = (char *)operator_new__(sVar1 + 1);
  strcpy(__dest,in_RSI);
  filterUnprintable(in_RDI,__dest);
  fputs(__dest,(FILE *)in_RDI->stream);
  fflush((FILE *)in_RDI->stream);
  if (__dest != (char *)0x0) {
    operator_delete__(__dest);
  }
  return;
}

Assistant:

void QAbstractTestLogger::outputString(const char *msg)
{
    QTEST_ASSERT(stream);
    QTEST_ASSERT(msg);

    char *filtered = new char[strlen(msg) + 1];
    strcpy(filtered, msg);
    filterUnprintable(filtered);

    ::fputs(filtered, stream);
    ::fflush(stream);

    delete [] filtered;
}